

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlRegFreeExecCtxt(xmlRegExecCtxtPtr exec)

{
  void *pvVar1;
  int iVar2;
  xmlRegExecRollback *pxVar3;
  xmlRegInputTokenPtr pxVar4;
  long lVar5;
  long lVar6;
  
  if (exec != (xmlRegExecCtxtPtr)0x0) {
    pxVar3 = exec->rollbacks;
    if (pxVar3 != (xmlRegExecRollback *)0x0) {
      if (exec->counts != (int *)0x0) {
        iVar2 = exec->maxRollbacks;
        if (0 < iVar2) {
          lVar5 = 0x10;
          lVar6 = 0;
          do {
            pvVar1 = *(void **)((long)&exec->rollbacks->state + lVar5);
            if (pvVar1 != (void *)0x0) {
              (*xmlFree)(pvVar1);
              iVar2 = exec->maxRollbacks;
            }
            lVar6 = lVar6 + 1;
            lVar5 = lVar5 + 0x18;
          } while (lVar6 < iVar2);
          pxVar3 = exec->rollbacks;
        }
      }
      (*xmlFree)(pxVar3);
    }
    if (exec->counts != (int *)0x0) {
      (*xmlFree)(exec->counts);
    }
    pxVar4 = exec->inputStack;
    if (pxVar4 != (xmlRegInputTokenPtr)0x0) {
      iVar2 = exec->inputStackNr;
      if (0 < iVar2) {
        lVar6 = 0;
        lVar5 = 0;
        do {
          pvVar1 = *(void **)((long)&exec->inputStack->value + lVar6);
          if (pvVar1 != (void *)0x0) {
            (*xmlFree)(pvVar1);
            iVar2 = exec->inputStackNr;
          }
          lVar5 = lVar5 + 1;
          lVar6 = lVar6 + 0x10;
        } while (lVar5 < iVar2);
        pxVar4 = exec->inputStack;
      }
      (*xmlFree)(pxVar4);
    }
    if (exec->errString != (xmlChar *)0x0) {
      (*xmlFree)(exec->errString);
    }
    (*xmlFree)(exec);
    return;
  }
  return;
}

Assistant:

void
xmlRegFreeExecCtxt(xmlRegExecCtxtPtr exec) {
    if (exec == NULL)
	return;

    if (exec->rollbacks != NULL) {
	if (exec->counts != NULL) {
	    int i;

	    for (i = 0;i < exec->maxRollbacks;i++)
		if (exec->rollbacks[i].counts != NULL)
		    xmlFree(exec->rollbacks[i].counts);
	}
	xmlFree(exec->rollbacks);
    }
    if (exec->counts != NULL)
	xmlFree(exec->counts);
    if (exec->inputStack != NULL) {
	int i;

	for (i = 0;i < exec->inputStackNr;i++) {
	    if (exec->inputStack[i].value != NULL)
		xmlFree(exec->inputStack[i].value);
	}
	xmlFree(exec->inputStack);
    }
    if (exec->errString != NULL)
        xmlFree(exec->errString);
    xmlFree(exec);
}